

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::Expect(Parser *this,int t)

{
  undefined8 extraout_RAX;
  int in_EDX;
  int t_00;
  undefined4 in_register_00000034;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (this->token_ == t) {
    Next(this);
    return;
  }
  TokenToString_abi_cxx11_(&local_30,(flatbuffers *)CONCAT44(in_register_00000034,t),in_EDX);
  std::operator+(&local_90,"expecting: ",&local_30);
  std::operator+(&local_70,&local_90," instead got: ");
  TokenToString_abi_cxx11_(&local_b0,(flatbuffers *)(ulong)(uint)this->token_,t_00);
  std::operator+(&local_50,&local_70,&local_b0);
  Error(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::Expect(int t) {
  if (t != token_) {
    Error("expecting: " + TokenToString(t) + " instead got: " +
          TokenToString(token_));
  }
  Next();
}